

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O1

int __thiscall
curlpp::FormParts::Content::clone
          (Content *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer pcVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x68);
  *puVar2 = &PTR__FormPart_00133b70;
  puVar2[1] = puVar2 + 3;
  pcVar1 = (this->super_FormPart).mName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 1),pcVar1,pcVar1 + (this->super_FormPart).mName._M_string_length);
  *puVar2 = &PTR__Content_00133bd0;
  puVar2[5] = puVar2 + 7;
  pcVar1 = (this->mContent)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 5),pcVar1,pcVar1 + (this->mContent)._M_string_length);
  puVar2[9] = puVar2 + 0xb;
  pcVar1 = (this->mContentType)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 9),pcVar1,pcVar1 + (this->mContentType)._M_string_length);
  return (int)puVar2;
}

Assistant:

curlpp::FormParts::Content *
curlpp::FormParts::Content::clone() const
{
   return new curlpp::FormParts::Content(*this);
}